

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__fs_scandir_cleanup(uv_fs_t *req)

{
  void *pvVar1;
  uint *puVar2;
  uint *nbufs;
  uv__dirent_t **dents;
  uv_fs_t *req_local;
  
  puVar2 = uv__get_nbufs(req);
  pvVar1 = req->ptr;
  if ((*puVar2 != 0) && (*puVar2 != (uint)req->result)) {
    *puVar2 = *puVar2 - 1;
  }
  while (*puVar2 < (uint)req->result) {
    free(*(void **)((long)pvVar1 + (ulong)*puVar2 * 8));
    *puVar2 = *puVar2 + 1;
  }
  free(req->ptr);
  req->ptr = (void *)0x0;
  return;
}

Assistant:

void uv__fs_scandir_cleanup(uv_fs_t* req) {
  uv__dirent_t** dents;

  unsigned int* nbufs = uv__get_nbufs(req);

  dents = req->ptr;
  if (*nbufs > 0 && *nbufs != (unsigned int) req->result)
    (*nbufs)--;
  for (; *nbufs < (unsigned int) req->result; (*nbufs)++)
    uv__fs_scandir_free(dents[*nbufs]);

  uv__fs_scandir_free(req->ptr);
  req->ptr = NULL;
}